

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall FDrawInfo::ClearFloodStencil(FDrawInfo *this,wallseg *ws)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ScopedColorMask colorMask;
  FQuadDrawer qd;
  
  iVar5 = GLPortal::recursion;
  (*_ptrc_glStencilOp)(0x1e00,0x1e00,0x1e03);
  gl_RenderState.mTextureEnabled = false;
  ScopedColorMask::ScopedColorMask(&colorMask,false,false,false,false);
  gl_RenderState.mColor.vec[0] = 1.0;
  gl_RenderState.mColor.vec[1] = 1.0;
  gl_RenderState.mColor.vec[2] = 1.0;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  FRenderState::Apply(&gl_RenderState);
  FQuadDrawer::FQuadDrawer(&qd);
  fVar1 = ws->z1;
  fVar2 = ws->x1;
  fVar3 = ws->y1;
  (qd.p)->x = fVar2;
  (qd.p)->z = fVar1;
  (qd.p)->y = fVar3;
  (qd.p)->u = 0.0;
  (qd.p)->v = 0.0;
  fVar4 = ws->z2;
  qd.p[1].x = fVar2;
  qd.p[1].z = fVar4;
  qd.p[1].y = fVar3;
  qd.p[1].u = 0.0;
  qd.p[1].v = 0.0;
  fVar2 = ws->x2;
  fVar3 = ws->y2;
  qd.p[2].x = fVar2;
  qd.p[2].z = fVar4;
  qd.p[2].y = fVar3;
  qd.p[2].u = 0.0;
  qd.p[2].v = 0.0;
  qd.p[3].x = fVar2;
  qd.p[3].z = fVar1;
  qd.p[3].y = fVar3;
  qd.p[3].u = 0.0;
  qd.p[3].v = 0.0;
  FQuadDrawer::Render(&qd,6);
  (*_ptrc_glStencilOp)(0x1e00,0x1e00,0x1e00);
  (*_ptrc_glStencilFunc)(0x202,iVar5,0xffffffff);
  gl_RenderState.mTextureEnabled = true;
  ScopedColorMask::~ScopedColorMask(&colorMask);
  (*_ptrc_glEnable)(0xb71);
  (*_ptrc_glDepthMask)('\x01');
  return;
}

Assistant:

void FDrawInfo::ClearFloodStencil(wallseg * ws)
{
	int recursion = GLPortal::GetRecursion();

	glStencilOp(GL_KEEP,GL_KEEP,GL_DECR);
	gl_RenderState.EnableTexture(false);
	{
		// Use revertible color mask, to avoid stomping on anaglyph 3D state
		ScopedColorMask colorMask(0, 0, 0, 0); // glColorMask(0,0,0,0);						// don't write to the graphics buffer
		gl_RenderState.ResetColor();

		gl_RenderState.Apply();
		FQuadDrawer qd;
		qd.Set(0, ws->x1, ws->z1, ws->y1, 0, 0);
		qd.Set(1, ws->x1, ws->z2, ws->y1, 0, 0);
		qd.Set(2, ws->x2, ws->z2, ws->y2, 0, 0);
		qd.Set(3, ws->x2, ws->z1, ws->y2, 0, 0);
		qd.Render(GL_TRIANGLE_FAN);

		// restore old stencil op.
		glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glStencilFunc(GL_EQUAL, recursion, ~0);
		gl_RenderState.EnableTexture(true);
	} // glColorMask(1, 1, 1, 1);
	glEnable(GL_DEPTH_TEST);
	glDepthMask(true);
}